

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O3

void __thiscall
embree::XMLWriter::store_array_text<float>
          (XMLWriter *this,char *name,vector<float,_std::allocator<float>_> *vec)

{
  pointer pfVar1;
  int __oflag;
  ulong uVar2;
  ulong uVar3;
  int local_7c;
  char *local_78;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__cxx11::string::string((string *)local_50,name,(allocator *)&local_7c);
  open(this,(char *)local_50,__oflag);
  local_78 = name;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  pfVar1 = (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pfVar1) {
    uVar3 = 0;
    do {
      if (this->ident != 0) {
        uVar2 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x10," ",1);
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->ident);
        pfVar1 = (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      local_7c = (int)pfVar1[uVar3];
      store_array_elt(this,&local_7c);
      uVar3 = uVar3 + 1;
      pfVar1 = (vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(vec->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pfVar1 >> 2));
  }
  std::__cxx11::string::string((string *)local_70,local_78,(allocator *)&local_7c);
  close(this,(int)local_70);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return;
}

Assistant:

void XMLWriter::store_array_text(const char* name, const std::vector<T>& vec)
  {
    open(name);
    for (size_t i=0; i<vec.size(); i++) {
      tab(); store_array_elt(vec[i]);
    }
    close(name);
  }